

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.hpp
# Opt level: O3

enable_if_t<std::is_base_of_v<Serializable,_Bar>,_void> __thiscall
miyuki::serialize::InputArchive::_load<Bar>(InputArchive *this,shared_ptr<Bar> *ptr)

{
  pointer *pprVar1;
  pointer *ppiVar2;
  json_value *pjVar3;
  uint uVar4;
  _Alloc_hider _Var5;
  size_type sVar6;
  shared_ptr<Bar> *psVar7;
  int iVar8;
  const_reference pvVar9;
  undefined4 extraout_var;
  const_iterator cVar11;
  int *piVar12;
  uint *puVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  iterator iVar15;
  element_type *peVar16;
  long lVar17;
  mapped_type *pmVar18;
  undefined8 uVar19;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var21;
  Bar *__tmp;
  element_type *peVar22;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *pbVar23;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> type_s;
  key_type local_a8;
  int local_84;
  key_type local_80;
  shared_ptr<Bar> *local_60;
  pointer local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  long *plVar10;
  
  pbVar23 = (this->stack).
            super__Vector_base<std::reference_wrapper<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>,_std::allocator<std::reference_wrapper<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1]._M_data;
  if (pbVar23->m_type == null) goto LAB_00115466;
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"type","");
  pvVar9 = nlohmann::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           ::at(pbVar23,&local_a8);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::
  get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            (&local_50,pvVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  iVar8 = (**this->context->_vptr_Context)(this->context,&local_50);
  plVar10 = (long *)CONCAT44(extraout_var,iVar8);
  pbVar23 = (this->stack).
            super__Vector_base<std::reference_wrapper<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>,_std::allocator<std::reference_wrapper<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1]._M_data;
  if (pbVar23->m_type == object) {
    cVar11 = std::
             _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>>
             ::_M_find_tr<char[6],void>
                       ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>>
                         *)(pbVar23->m_value).object,(char (*) [6])"props");
    pjVar3 = &pbVar23->m_value;
    pbVar23 = (this->stack).
              super__Vector_base<std::reference_wrapper<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>,_std::allocator<std::reference_wrapper<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1]._M_data;
    if ((_Rb_tree_header *)cVar11._M_node != &(pjVar3->object->_M_t)._M_impl.super__Rb_tree_header)
    {
      if ((pbVar23->m_type == object) &&
         (cVar11 = std::
                   _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>>
                   ::_M_find_tr<char[5],void>
                             ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>>
                               *)(pbVar23->m_value).object,(char (*) [5])"addr"),
         (_Rb_tree_header *)cVar11._M_node !=
         &(((pbVar23->m_value).object)->_M_t)._M_impl.super__Rb_tree_header)) {
        pbVar23 = (this->stack).
                  super__Vector_base<std::reference_wrapper<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>,_std::allocator<std::reference_wrapper<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1]._M_data;
        local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"addr","");
        pvVar9 = nlohmann::
                 basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 ::at(pbVar23,&local_80);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::
        get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  (&local_a8,pvVar9);
        _Var5._M_p = local_a8._M_dataplus._M_p;
        piVar12 = __errno_location();
        local_84 = *piVar12;
        *piVar12 = 0;
        local_60 = (shared_ptr<Bar> *)strtol(_Var5._M_p,&local_58,10);
        if (local_58 == _Var5._M_p) goto LAB_001157e5;
        if (*piVar12 == 0) {
          *piVar12 = local_84;
        }
        else {
          pbVar23 = (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                     *)&local_80.field_2;
          if (*piVar12 == 0x22) {
            std::__throw_out_of_range("stol");
            goto LAB_001153d0;
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
        psVar7 = local_60;
        local_a8._M_dataplus._M_p = (pointer)local_60;
        iVar15 = std::
                 _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<miyuki::serialize::Serializable>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<miyuki::serialize::Serializable>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 ::find(&(this->ptrs)._M_h,(key_type *)&local_a8);
        if (iVar15.
            super__Node_iterator_base<std::pair<const_unsigned_long,_std::shared_ptr<miyuki::serialize::Serializable>_>,_false>
            ._M_cur == (__node_type *)0x0) {
          lVar17 = (**(code **)(*plVar10 + 8))(plVar10);
          if (lVar17 == 0) {
            local_a8._M_dataplus._M_p = (pointer)0x0;
          }
          else {
            local_a8._M_dataplus._M_p =
                 (pointer)__dynamic_cast(lVar17,&Serializable::typeinfo,&Bar::typeinfo,0);
          }
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Bar*>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_a8._M_string_length,
                     (Bar *)local_a8._M_dataplus._M_p);
          sVar6 = local_a8._M_string_length;
          _Var5._M_p = local_a8._M_dataplus._M_p;
          local_a8._M_dataplus._M_p = (pointer)0x0;
          local_a8._M_string_length = 0;
          p_Var20 = (ptr->super___shared_ptr<Bar,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
          (ptr->super___shared_ptr<Bar,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
               (element_type *)_Var5._M_p;
          (ptr->super___shared_ptr<Bar,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar6;
          if ((p_Var20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var20),
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._M_string_length !=
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._M_string_length);
          }
          local_a8._M_dataplus._M_p = (pointer)psVar7;
          pmVar18 = std::__detail::
                    _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<miyuki::serialize::Serializable>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<miyuki::serialize::Serializable>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<miyuki::serialize::Serializable>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<miyuki::serialize::Serializable>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                  *)&this->ptrs,(key_type *)&local_a8);
          (pmVar18->super___shared_ptr<miyuki::serialize::Serializable,_(__gnu_cxx::_Lock_policy)2>)
          ._M_ptr = &((ptr->super___shared_ptr<Bar,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                     super_Serializable;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    (&(pmVar18->
                      super___shared_ptr<miyuki::serialize::Serializable,_(__gnu_cxx::_Lock_policy)2>
                      )._M_refcount,
                     &(ptr->super___shared_ptr<Bar,_(__gnu_cxx::_Lock_policy)2>)._M_refcount);
        }
        else {
          if (*(long *)((long)iVar15.
                              super__Node_iterator_base<std::pair<const_unsigned_long,_std::shared_ptr<miyuki::serialize::Serializable>_>,_false>
                              ._M_cur + 0x10) == 0) {
            p_Var21 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            peVar22 = (element_type *)0x0;
          }
          else {
            peVar16 = (element_type *)
                      __dynamic_cast(*(long *)((long)iVar15.
                                                  super__Node_iterator_base<std::pair<const_unsigned_long,_std::shared_ptr<miyuki::serialize::Serializable>_>,_false>
                                                  ._M_cur + 0x10),&Serializable::typeinfo,
                                     &Bar::typeinfo,0);
            p_Var21 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            peVar22 = (element_type *)0x0;
            if (peVar16 != (element_type *)0x0) {
              p_Var21 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                         ((long)iVar15.
                                super__Node_iterator_base<std::pair<const_unsigned_long,_std::shared_ptr<miyuki::serialize::Serializable>_>,_false>
                                ._M_cur + 0x18);
              peVar22 = peVar16;
              if (p_Var21 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                p_Var21 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              }
              else if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var21->_M_use_count = p_Var21->_M_use_count + 1;
                UNLOCK();
              }
              else {
                p_Var21->_M_use_count = p_Var21->_M_use_count + 1;
              }
            }
          }
          (ptr->super___shared_ptr<Bar,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = peVar22;
          p_Var20 = (ptr->super___shared_ptr<Bar,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
          (ptr->super___shared_ptr<Bar,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi = p_Var21;
joined_r0x00115594:
          if (p_Var20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var20);
          }
        }
      }
      else {
        lVar17 = (**(code **)(*plVar10 + 8))(plVar10);
        if (lVar17 == 0) {
          local_a8._M_dataplus._M_p = (pointer)0x0;
        }
        else {
          local_a8._M_dataplus._M_p =
               (pointer)__dynamic_cast(lVar17,&Serializable::typeinfo,&Bar::typeinfo,0);
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Bar*>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_a8._M_string_length,
                   (Bar *)local_a8._M_dataplus._M_p);
        sVar6 = local_a8._M_string_length;
        _Var5._M_p = local_a8._M_dataplus._M_p;
        local_a8._M_dataplus._M_p = (pointer)0x0;
        local_a8._M_string_length = 0;
        p_Var20 = (ptr->super___shared_ptr<Bar,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
        (ptr->super___shared_ptr<Bar,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
             (element_type *)_Var5._M_p;
        (ptr->super___shared_ptr<Bar,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar6;
        if (p_Var20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var20);
          p_Var20 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._M_string_length;
          goto joined_r0x00115594;
        }
      }
      pbVar23 = (this->stack).
                super__Vector_base<std::reference_wrapper<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>,_std::allocator<std::reference_wrapper<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish[-1]._M_data;
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"props","");
      pvVar9 = nlohmann::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
               ::at(pbVar23,&local_a8);
      _makeNode(this,pvVar9);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      (**(code **)(*plVar10 + 0x18))
                (plVar10,(ptr->super___shared_ptr<Bar,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,this);
      pprVar1 = &(this->stack).
                 super__Vector_base<std::reference_wrapper<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>,_std::allocator<std::reference_wrapper<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *pprVar1 = *pprVar1 + -1;
      ppiVar2 = &(this->counter).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppiVar2 = *ppiVar2 + -1;
      goto LAB_001157a3;
    }
  }
LAB_001153d0:
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"addr","");
  local_60 = ptr;
  pvVar9 = nlohmann::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           ::at(pbVar23,&local_80);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::
  get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            (&local_a8,pvVar9);
  _Var5._M_p = local_a8._M_dataplus._M_p;
  puVar13 = (uint *)__errno_location();
  uVar4 = *puVar13;
  ptr = (shared_ptr<Bar> *)(ulong)uVar4;
  *puVar13 = 0;
  paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)strtol(_Var5._M_p,&local_58,10);
  if (local_58 == _Var5._M_p) {
    std::__throw_invalid_argument("stol");
  }
  else {
    if (*puVar13 == 0) {
      *puVar13 = uVar4;
    }
    else if (*puVar13 == 0x22) {
      std::__throw_out_of_range("stol");
LAB_00115466:
      p_Var20 = (ptr->super___shared_ptr<Bar,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
      (ptr->super___shared_ptr<Bar,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = (element_type *)0x0;
      (ptr->super___shared_ptr<Bar,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (p_Var20 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        return;
      }
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var20);
      return;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    local_a8._M_dataplus._M_p = (pointer)paVar14;
    iVar15 = std::
             _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<miyuki::serialize::Serializable>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<miyuki::serialize::Serializable>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             ::find(&(this->ptrs)._M_h,(key_type *)&local_a8);
    if (iVar15.
        super__Node_iterator_base<std::pair<const_unsigned_long,_std::shared_ptr<miyuki::serialize::Serializable>_>,_false>
        ._M_cur != (__node_type *)0x0) {
      if (*(long *)((long)iVar15.
                          super__Node_iterator_base<std::pair<const_unsigned_long,_std::shared_ptr<miyuki::serialize::Serializable>_>,_false>
                          ._M_cur + 0x10) == 0) {
        p_Var20 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        peVar22 = (element_type *)0x0;
      }
      else {
        peVar16 = (element_type *)
                  __dynamic_cast(*(long *)((long)iVar15.
                                                 super__Node_iterator_base<std::pair<const_unsigned_long,_std::shared_ptr<miyuki::serialize::Serializable>_>,_false>
                                                 ._M_cur + 0x10),&Serializable::typeinfo,
                                 &Bar::typeinfo,0);
        p_Var20 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        peVar22 = (element_type *)0x0;
        if (peVar16 != (element_type *)0x0) {
          p_Var20 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                     ((long)iVar15.
                            super__Node_iterator_base<std::pair<const_unsigned_long,_std::shared_ptr<miyuki::serialize::Serializable>_>,_false>
                            ._M_cur + 0x18);
          peVar22 = peVar16;
          if (p_Var20 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            p_Var20 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          }
          else if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var20->_M_use_count = p_Var20->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var20->_M_use_count = p_Var20->_M_use_count + 1;
          }
        }
      }
      (local_60->super___shared_ptr<Bar,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = peVar22;
      p_Var21 = (local_60->super___shared_ptr<Bar,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
      (local_60->super___shared_ptr<Bar,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi = p_Var20;
      if (p_Var21 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var21);
      }
LAB_001157a3:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      return;
    }
  }
  std::__throw_out_of_range("_Map_base::at");
LAB_001157e5:
  uVar19 = std::__throw_invalid_argument("stol");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  _Unwind_Resume(uVar19);
}

Assistant:

std::enable_if_t<std::is_base_of_v<Serializable, T>, void>
        _load(std::shared_ptr<T> &ptr) {
            if (_top().is_null()) {
                ptr = nullptr;
                return;
            }
            auto type_s = _top().at("type").get<std::string>();
            auto type = context.getType(type_s);
            if (_top().contains("props")) {
                if (_top().contains("addr")) {
                    auto addr = std::stol(_top().at("addr").get<std::string>());
                    auto it = ptrs.find(addr);
                    if (it == ptrs.end()) {
                        ptr = std::shared_ptr<T>(dynamic_cast<T *>(type->_create()));
                        ptrs[addr] = ptr;
                    } else {
                        ptr = std::dynamic_pointer_cast<T>(it->second);
                    }
                } else {
                    ptr = std::shared_ptr<T>(dynamic_cast<T *>(type->_create()));
                }
                _makeNode(_top().at("props"));
                type->load(*ptr, *this);
                _popNode();
            } else {
                auto addr = std::stol(_top().at("addr").get<std::string>());
                ptr = std::dynamic_pointer_cast<T>(ptrs.at(addr));
            }
        }